

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O1

void __thiscall
Commands::command_handler_register_helper::
Register<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,bool))(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*,bool)>>
          (command_handler_register_helper *this,command_info *info,
          _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_bool))(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*,_bool)>
          *f,int flags)

{
  pointer pcVar1;
  undefined8 uVar2;
  command_handler_register *this_00;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  command_info local_110;
  command_handler local_b0;
  
  this_00 = command_handler_register_instance;
  local_110.name._M_dataplus._M_p = (pointer)&local_110.name.field_2;
  pcVar1 = (info->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar1,pcVar1 + (info->name)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110.arguments,&info->arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110.optional_arguments,&info->optional_arguments);
  local_110.require_character = info->require_character;
  local_110.duty_restrict = info->duty_restrict;
  local_110.partial_min_chars = info->partial_min_chars;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_128 = (code *)0x0;
  pcStack_120 = (code *)0x0;
  local_138._M_unused._M_object = operator_new(0x10);
  uVar2 = *(undefined8 *)&f->_M_bound_args;
  *(_func_void_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_Command_Source_ptr_bool
    **)local_138._M_unused._0_8_ = f->_M_f;
  *(undefined8 *)((long)local_138._M_unused._0_8_ + 8) = uVar2;
  pcStack_120 = std::
                _Function_handler<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_bool))(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*,_bool)>_>
                ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_bool))(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*,_bool)>_>
              ::_M_manager;
  command_handler::command_handler
            (&local_b0,&local_110,
             (function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
              *)&local_138);
  command_handler_register::Register(this_00,&local_b0,flags);
  if (local_b0.f.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b0.f.super__Function_base._M_manager)
              ((_Any_data *)&local_b0.f,(_Any_data *)&local_b0.f,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.info.optional_arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.info.arguments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.info.name._M_dataplus._M_p != &local_b0.info.name.field_2) {
    operator_delete(local_b0.info.name._M_dataplus._M_p,
                    local_b0.info.name.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110.optional_arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110.arguments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.name._M_dataplus._M_p != &local_110.name.field_2) {
    operator_delete(local_110.name._M_dataplus._M_p,local_110.name.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void Register(command_info info, const F& f, int flags = 0)
		{
			command_handler_register_instance->Register(command_handler(info, std::function<void(const std::vector<std::string>&, Command_Source*)>(f)), flags);
		}